

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::EmptyStatementSyntax::setChild
          (EmptyStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined4 uVar1;
  SyntaxNode *pSVar2;
  SyntaxNode *pSVar3;
  NamedLabelSyntax *pNVar4;
  Token TVar5;
  
  if (index == 2) {
    TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->semicolon).kind = TVar5.kind;
    (this->semicolon).field_0x2 = TVar5._2_1_;
    (this->semicolon).numFlags = (NumericTokenFlags)TVar5.numFlags.raw;
    (this->semicolon).rawLen = TVar5.rawLen;
    (this->semicolon).info = TVar5.info;
  }
  else if (index == 1) {
    pSVar2 = TokenOrSyntax::node(&child);
    uVar1 = *(undefined4 *)&pSVar2->field_0x4;
    pSVar3 = pSVar2->parent;
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
         pSVar2->kind;
    *(undefined4 *)
     &(this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 =
         uVar1;
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
         pSVar2->previewNode;
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
         *(size_t *)(pSVar2 + 1);
    pSVar3 = pSVar2[1].previewNode;
    (this->super_StatementSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
         (pointer)pSVar2[1].parent;
    (this->super_StatementSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = (size_t)pSVar3;
  }
  else {
    pSVar3 = TokenOrSyntax::node(&child);
    if (pSVar3 == (SyntaxNode *)0x0) {
      pNVar4 = (NamedLabelSyntax *)0x0;
    }
    else {
      pNVar4 = (NamedLabelSyntax *)TokenOrSyntax::node(&child);
    }
    (this->super_StatementSyntax).label = pNVar4;
  }
  return;
}

Assistant:

void EmptyStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: semicolon = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}